

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::TypedExpectation<void_(double,_double)>::Matches
          (TypedExpectation<void_(double,_double)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<double>,testing::Matcher<double>>,std::tuple<double,double>>
                    ((tuple<testing::Matcher<double>,_testing::Matcher<double>_> *)(this + 0xf0),
                     args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<double,_double>_&>::Matches
                      ((MatcherBase<const_std::tuple<double,_double>_&> *)(this + 0x120),args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }